

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O0

void append_format_string(string *data,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined8 local_10e8;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  int local_104c;
  undefined4 local_1048;
  int len;
  va_list ap;
  int local_1024;
  char *pcStack_1020;
  int cur_buf_len;
  char *backup_buf;
  char buf [4096];
  char *format_local;
  string *data_local;
  
  if (in_AL != '\0') {
    local_10d8 = in_XMM0_Qa;
    local_10c8 = in_XMM1_Qa;
    local_10b8 = in_XMM2_Qa;
    local_10a8 = in_XMM3_Qa;
    local_1098 = in_XMM4_Qa;
    local_1088 = in_XMM5_Qa;
    local_1078 = in_XMM6_Qa;
    local_1068 = in_XMM7_Qa;
  }
  local_10f8 = in_RDX;
  local_10f0 = in_RCX;
  local_10e8 = in_R8;
  local_10e0 = in_R9;
  buf._4088_8_ = format;
  memset(&backup_buf,0,0x1000);
  pcStack_1020 = (char *)0x0;
  local_1024 = 0x1000;
  ap[0].overflow_arg_area = local_1108;
  ap[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_1048 = 0x10;
  local_104c = vsnprintf((char *)&backup_buf,0x1000,(char *)buf._4088_8_,&local_1048);
  while (local_1024 <= local_104c) {
    local_1024 = local_1024 << 1;
    if (pcStack_1020 != (char *)0x0) {
      free(pcStack_1020);
    }
    pcStack_1020 = (char *)calloc(1,(long)local_1024);
    ap[0].overflow_arg_area = local_1108;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_1048 = 0x10;
    local_104c = vsnprintf(pcStack_1020,(long)local_1024,(char *)buf._4088_8_,&local_1048);
  }
  if (pcStack_1020 == (char *)0x0) {
    std::__cxx11::string::append((char *)data);
  }
  else {
    std::__cxx11::string::append((char *)data);
    free(pcStack_1020);
  }
  return;
}

Assistant:

void append_format_string(std::string& data, const char* format, ...) {
  char buf[4096] = {};
  char* backup_buf = NULL;
  int cur_buf_len = sizeof(buf);
  va_list ap;
  va_start(ap, format);
  int len = vsnprintf(buf, cur_buf_len, format, ap);
  va_end(ap);
  while(len >= cur_buf_len) {
    cur_buf_len *= 2;
    if(backup_buf) {
      free(backup_buf);
    }

    backup_buf = (char*)calloc(1, cur_buf_len);
    va_start(ap, format);
    len = vsnprintf(backup_buf, cur_buf_len, format, ap);
    va_end(ap);
  }
  

  if(backup_buf) {
    data.append(backup_buf);
    free(backup_buf);
  } else {
    data.append(buf);
  }  
}